

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Instance::writeTo(Instance *this,BinaryWriter *binary)

{
  int32_t local_2c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->xfm);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Object,void>
            (local_28,&(this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
  local_2c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_2c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return 4;
}

Assistant:

int Instance::writeTo(BinaryWriter &binary) 
  {
    binary.write(xfm);
    binary.write(binary.serialize(object));
    return TYPE_INSTANCE;
  }